

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall ViconDataStreamSDK::Core::VClient::GetEyeTrackerCount(VClient *this,uint *o_rCount)

{
  Enum EVar1;
  bool bVar2;
  size_type sVar3;
  Enum local_2c;
  undefined1 local_28 [4];
  Enum GetResult;
  scoped_lock Lock;
  uint *o_rCount_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rCount;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_28,&this->m_FrameMutex);
  local_2c = Success;
  bVar2 = InitGet<unsigned_int>(this,&local_2c,(uint *)Lock._8_8_);
  if (bVar2) {
    sVar3 = std::
            vector<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
            ::size(&(this->m_LatestFrame).m_EyeTrackers);
    *(int *)Lock._8_8_ = (int)sVar3;
  }
  EVar1 = local_2c;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_28);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetEyeTrackerCount( unsigned int & o_rCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult, o_rCount ) )
  {
    o_rCount = static_cast<unsigned int>( m_LatestFrame.m_EyeTrackers.size() );
  }
  return GetResult;
}